

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

void covenant::remove<std::vector<covenant::Sym,std::allocator<covenant::Sym>>>
               (vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                *vec,size_t pos)

{
  pointer pvVar1;
  difference_type __d;
  
  pvVar1 = (vec->
           super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pos < (ulong)(((long)(vec->
                           super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
    std::
    vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
    ::erase(vec,pvVar1 + pos);
    return;
  }
  __assert_fail("pos < vec.size() && \"Out-of-bounds access\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/Common.h"
                ,0x7c,"void covenant::remove(vector<T> &, size_t) [T = std::vector<covenant::Sym>]")
  ;
}

Assistant:

void remove(vector<T>& vec, size_t pos)
  {
    assert(pos < vec.size() && "Out-of-bounds access");
    typename vector<T>::iterator it = vec.begin();
    advance(it, pos);
    vec.erase(it);
  }